

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hiredis.c
# Opt level: O3

int redisBufferWrite(redisContext *c,int *done)

{
  char *pcVar1;
  uint start;
  ulong uVar2;
  sds pcVar3;
  uint uVar4;
  
  if (c->err != 0) {
    return -1;
  }
  pcVar1 = c->obuf;
  switch(pcVar1[-1] & 7) {
  case 0:
    uVar2 = (ulong)((byte)pcVar1[-1] >> 3);
    break;
  case 1:
    uVar2 = (ulong)(byte)pcVar1[-3];
    break;
  case 2:
    uVar2 = (ulong)*(ushort *)(pcVar1 + -5);
    break;
  case 3:
    uVar2 = (ulong)*(uint *)(pcVar1 + -9);
    break;
  case 4:
    uVar2 = *(ulong *)(pcVar1 + -0x11);
    break;
  default:
    goto switchD_00106251_default;
  }
  if (uVar2 != 0) {
    start = (*c->funcs->write)(c);
    if ((int)start < 1) {
      if ((int)start < 0) {
        return -1;
      }
    }
    else {
      pcVar3 = c->obuf;
      switch(pcVar3[-1] & 7) {
      case 0:
        uVar4 = (uint)((byte)pcVar3[-1] >> 3);
        break;
      case 1:
        uVar4 = (uint)(byte)pcVar3[-3];
        break;
      case 2:
        uVar4 = (uint)*(ushort *)(pcVar3 + -5);
        break;
      case 3:
        uVar4 = *(uint *)(pcVar3 + -9);
        break;
      case 4:
        uVar4 = (uint)*(undefined8 *)(pcVar3 + -0x11);
        break;
      default:
        uVar4 = 0;
      }
      if (start == uVar4) {
        sdsfree(pcVar3);
        pcVar3 = sdsempty();
        c->obuf = pcVar3;
      }
      else {
        sdsrange(pcVar3,start,-1);
      }
    }
  }
switchD_00106251_default:
  if (done != (int *)0x0) {
    pcVar1 = c->obuf;
    switch(pcVar1[-1] & 7) {
    case 0:
      uVar2 = (ulong)((byte)pcVar1[-1] >> 3);
      break;
    case 1:
      uVar2 = (ulong)(byte)pcVar1[-3];
      break;
    case 2:
      uVar2 = (ulong)*(ushort *)(pcVar1 + -5);
      break;
    case 3:
      uVar2 = (ulong)*(uint *)(pcVar1 + -9);
      break;
    case 4:
      uVar2 = *(ulong *)(pcVar1 + -0x11);
      break;
    default:
      uVar2 = 0;
    }
    *done = (uint)(uVar2 == 0);
  }
  return 0;
}

Assistant:

int redisBufferWrite(redisContext *c, int *done) {

    /* Return early when the context has seen an error. */
    if (c->err)
        return REDIS_ERR;

    if (sdslen(c->obuf) > 0) {
        int nwritten = c->funcs->write(c);
        if (nwritten < 0) {
            return REDIS_ERR;
        } else if (nwritten > 0) {
            if (nwritten == (signed)sdslen(c->obuf)) {
                sdsfree(c->obuf);
                c->obuf = sdsempty();
            } else {
                sdsrange(c->obuf,nwritten,-1);
            }
        }
    }
    if (done != NULL) *done = (sdslen(c->obuf) == 0);
    return REDIS_OK;
}